

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

GenerateBlockArraySymbol *
slang::ast::GenerateBlockArraySymbol::fromSyntax
          (Compilation *comp,LoopGenerateSyntax *syntax,SymbolIndex scopeIndex,ASTContext *context,
          uint32_t constructIndex)

{
  group_type_pointer pgVar1;
  Scope *scope;
  Type *this;
  Type *lhs;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined4 uVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  undefined1 auVar5 [16];
  pointer ppGVar6;
  undefined8 uVar7;
  __index_type _Var8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  GenerateBlockArraySymbol *gba;
  GenerateBlockArraySymbol *this_00;
  Scope *pSVar13;
  Symbol *pSVar14;
  Expression *pEVar15;
  StatementBlockSymbol *pSVar16;
  VariableSymbol *symbol;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__v;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar17;
  Diagnostic *pDVar18;
  size_t sVar19;
  undefined4 extraout_var_01;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_02;
  SourceLocation SVar20;
  DiagCode code;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *member;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong pos0;
  long lVar24;
  Compilation *pCVar25;
  ulong hash;
  SVInt *index;
  long lVar26;
  ulong uVar27;
  SVIntStorage *other;
  undefined1 auVar28 [16];
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  byte bVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  byte bVar40;
  uchar uVar41;
  uchar uVar42;
  uchar uVar43;
  byte bVar44;
  LookupLocation location;
  SourceRange SVar45;
  SourceRange SVar46;
  string_view sVar47;
  Token genvar;
  ConstantValue stop;
  IdentifierNameSyntax *genvarSyntax;
  anon_class_48_6_985204b5 createBlock;
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> entries;
  ConstantValue initialVal;
  SmallSet<slang::SVInt,_8UL,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
  usedValues;
  locator res;
  SmallVector<slang::SVInt,_8UL> indices;
  EvalContext evalContext;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffff878;
  Token local_768;
  Expression *local_750;
  SourceLocation local_748;
  Compilation *local_740;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *local_738;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_730;
  char local_710;
  ulong local_708;
  IdentifierNameSyntax *local_700;
  ulong local_6f8;
  ulong local_6f0;
  ulong local_6e8;
  ulong local_6e0;
  value_type_pointer local_6d8;
  ulong local_6d0;
  uint32_t local_6c4;
  SourceRange local_6c0;
  anon_class_48_6_985204b5 local_6b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_680;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_668;
  undefined1 local_648;
  undefined1 local_640 [24];
  Symbol *pSStack_628;
  undefined1 local_620 [16];
  AssertionInstanceDetails *local_610;
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> local_608;
  uchar local_5c8;
  uchar uStack_5c7;
  uchar uStack_5c6;
  byte bStack_5c5;
  uchar uStack_5c4;
  uchar uStack_5c3;
  uchar uStack_5c2;
  byte bStack_5c1;
  uchar uStack_5c0;
  uchar uStack_5bf;
  uchar uStack_5be;
  byte bStack_5bd;
  uchar uStack_5bc;
  uchar uStack_5bb;
  uchar uStack_5ba;
  byte bStack_5b9;
  uchar local_5b8;
  uchar uStack_5b7;
  uchar uStack_5b6;
  byte bStack_5b5;
  uchar uStack_5b4;
  uchar uStack_5b3;
  uchar uStack_5b2;
  byte bStack_5b1;
  uchar uStack_5b0;
  uchar uStack_5af;
  uchar uStack_5ae;
  byte bStack_5ad;
  uchar uStack_5ac;
  uchar uStack_5ab;
  uchar uStack_5aa;
  byte bStack_5a9;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_5a8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_580;
  SourceLocation local_558 [16];
  Storage *local_4d8;
  undefined1 local_4d0 [32];
  value_type_pointer pSStack_4b0;
  size_ctrl_type local_4a8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_498;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_470;
  SmallVectorBase<slang::SVInt> local_448 [3];
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_3b0;
  undefined1 local_388 [8];
  char *pcStack_380;
  bitmask<slang::ast::ASTFlags> local_378;
  Symbol *pSStack_370;
  TempVarSymbol *local_368;
  RandomizeDetails *pRStack_360;
  AssertionInstanceDetails *local_358;
  bitmask<slang::ast::EvalFlags> local_350;
  undefined1 local_34c [16];
  undefined4 local_33c;
  SmallVectorBase<slang::ast::EvalContext::Frame> local_338;
  LValue **local_280;
  size_type local_278;
  size_type local_270;
  LValue *local_268 [5];
  SmallVectorBase<slang::Diagnostic> local_240;
  SmallVectorBase<slang::Diagnostic> local_148;
  SourceRange local_50;
  bool local_40;
  
  local_6c4 = constructIndex;
  getGenerateBlockName(&local_680,&((syntax->block).ptr)->super_SyntaxNode);
  this_00 = BumpAllocator::
            emplace<slang::ast::GenerateBlockArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&>
                      (&comp->super_BumpAllocator,comp,&local_680.first,&local_680.second,&local_6c4
                      );
  (this_00->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this_00->super_Symbol,(context->scope).ptr,syntax_00);
  local_768.kind = (syntax->identifier).kind;
  local_768._2_1_ = (syntax->identifier).field_0x2;
  local_768.numFlags.raw = (syntax->identifier).numFlags;
  local_768.rawLen = (syntax->identifier).rawLen;
  local_768.info = (syntax->identifier).info;
  if ((local_768._0_8_ & 0x10000) != 0) {
    return this_00;
  }
  local_740 = comp;
  local_700 = BumpAllocator::emplace<slang::syntax::IdentifierNameSyntax,slang::parsing::Token&>
                        (&comp->super_BumpAllocator,&local_768);
  pCVar25 = local_740;
  scope = (context->scope).ptr;
  lVar26 = 0;
  pSVar13 = scope;
  do {
    pSVar14 = pSVar13->thisSym;
    if (pSVar14->kind != GenerateBlock) {
      if (pSVar14->kind != GenerateBlockArray) break;
      lVar26 = (lVar26 + (ulong)(lVar26 == 0)) * *(long *)(pSVar14 + 2);
    }
    pSVar13 = pSVar14->parentScope;
  } while (pSVar13 != (Scope *)0x0);
  local_750 = (Expression *)CONCAT44(local_750._4_4_,scopeIndex);
  uVar27 = lVar26 + (ulong)(lVar26 == 0);
  local_708 = (ulong)(local_740->options).maxGenerateSteps;
  local_748 = (SourceLocation)context;
  if ((syntax->genvar).info == (Info *)0x0) {
    sVar47 = parsing::Token::valueText(&local_768);
    uVar3 = context->scope;
    uVar4 = context->lookupIndex;
    location.index = uVar4;
    location.scope = (Scope *)uVar3;
    local_6c0 = parsing::Token::range(&local_768);
    location._12_4_ = 0;
    in_stack_fffffffffffff878.m_bits = (underlying_type)local_6c0.startLoc;
    pSVar14 = Lookup::unqualifiedAt
                        (scope,sVar47,location,local_6c0,(bitmask<slang::ast::LookupFlags>)0x0);
    pCVar25 = local_740;
    if (pSVar14 == (Symbol *)0x0) {
      return this_00;
    }
    if (pSVar14->kind != Genvar) {
      SVar46 = parsing::Token::range(&local_768);
      pDVar18 = ASTContext::addDiag((ASTContext *)local_748,(DiagCode)0x20000a,SVar46);
      sVar47 = parsing::Token::valueText(&local_768);
      Diagnostic::operator<<(pDVar18,sVar47);
      Diagnostic::addNote(pDVar18,(DiagCode)0x50001,pSVar14->location);
      return this_00;
    }
    Compilation::noteReference(local_740,pSVar14,false);
  }
  else {
    _local_388 = parsing::Token::valueText(&local_768);
    local_558[0] = parsing::Token::location(&local_768);
    pSVar14 = &BumpAllocator::
               emplace<slang::ast::GenvarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                         (&pCVar25->super_BumpAllocator,
                          (basic_string_view<char,_std::char_traits<char>_> *)local_388,local_558)->
               super_Symbol;
    pSVar14->originatingSyntax = (SyntaxNode *)local_700;
    Scope::insertMember(&this_00->super_Scope,pSVar14,(this_00->super_Scope).lastMember,false,true);
  }
  local_608.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.data_ =
       (pointer)local_608.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.
                firstElement;
  local_608.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.len = 0;
  local_608.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.cap = 5;
  local_6b0.blockLoc = local_680.second;
  local_6b0.entries = &local_608;
  local_6b0.genvar = &local_768;
  local_6b0.genvarSyntax = &local_700;
  this = pCVar25->integerType;
  lhs = (Type *)(syntax->initialExpr).ptr;
  local_6b0.comp = pCVar25;
  local_6b0.syntax = syntax;
  SVar45 = parsing::Token::range(&syntax->equals);
  SVar20 = local_748;
  SVar46.endLoc = local_748;
  SVar46.startLoc = SVar45.endLoc;
  pEVar15 = Expression::bindRValue
                      ((Expression *)this,lhs,(ExpressionSyntax *)SVar45.startLoc,SVar46,
                       (ASTContext *)0x0,in_stack_fffffffffffff878);
  ASTContext::eval((ConstantValue *)&local_5a8,(ASTContext *)SVar20,pEVar15,
                   (bitmask<slang::ast::EvalFlags>)0x0);
  if (local_5a8._M_index != '\0') {
    auVar5._12_4_ = 0;
    auVar5._0_12_ = stack0xfffffffffffffc7c;
    _local_388 = (string_view)(auVar5 << 0x20);
    local_558[0] = (SourceLocation)((ulong)local_558[0] & 0xffffffff00000000);
    pSVar16 = BumpAllocator::
              emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,char_const(&)[1],slang::SourceLocation&,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                        (&local_740->super_BumpAllocator,local_740,(char (*) [1])0x9db414,
                         &local_680.second,(StatementBlockKind *)local_388,
                         (VariableLifetime *)local_558);
    _local_388 = parsing::Token::valueText(&local_768);
    local_558[0] = parsing::Token::location(&local_768);
    pCVar25 = local_740;
    local_448[0].data_ = (pointer)((ulong)local_448[0].data_._4_4_ << 0x20);
    symbol = BumpAllocator::
             emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime>
                       (&local_740->super_BumpAllocator,
                        (basic_string_view<char,_std::char_traits<char>_> *)local_388,local_558,
                        (VariableLifetime *)local_448);
    SVar20 = local_748;
    (symbol->super_ValueSymbol).declaredType.type = pCVar25->integerType;
    *(byte *)&(symbol->flags).m_bits = (byte)(symbol->flags).m_bits | 2;
    (pSVar16->super_Symbol).parentScope = *(Scope **)local_748;
    (pSVar16->super_Symbol).indexInScope = (SymbolIndex)local_750;
    Scope::insertMember(&pSVar16->super_Scope,(Symbol *)symbol,(pSVar16->super_Scope).lastMember,
                        false,true);
    local_640._8_4_ = 0xffffffff;
    stack0xfffffffffffff9d0 = (undefined1  [16])0x0;
    local_620 = (undefined1  [16])0x0;
    local_610 = (AssertionInstanceDetails *)0x0;
    local_640._0_8_ = &pSVar16->super_Scope;
    iVar11 = Expression::bind((int)(syntax->stopExpr).ptr,(sockaddr *)local_640,0);
    pEVar15 = (Expression *)CONCAT44(extraout_var,iVar11);
    iVar11 = Expression::bind((int)(syntax->iterationExpr).ptr,(sockaddr *)local_640,8);
    local_750 = (Expression *)CONCAT44(extraout_var_00,iVar11);
    bVar9 = Expression::bad(pEVar15);
    if (((!bVar9) && (bVar9 = Expression::bad(local_750), !bVar9)) &&
       (bVar9 = ASTContext::requireBooleanConvertible((ASTContext *)SVar20,pEVar15), bVar9)) {
      local_338.data_ = (pointer)local_338.firstElement;
      local_358 = local_610;
      pcStack_380._4_4_ = local_640._12_4_;
      pcStack_380._0_4_ = local_640._8_4_;
      local_368 = (TempVarSymbol *)local_620._0_8_;
      pRStack_360 = (RandomizeDetails *)local_620._8_8_;
      local_378.m_bits = local_640._16_8_;
      pSStack_370 = pSStack_628;
      local_388 = (undefined1  [8])local_640._0_8_;
      local_350.m_bits = '\0';
      local_34c = (undefined1  [16])0x0;
      local_33c = 0;
      local_338.len = 0;
      local_338.cap = 2;
      local_280 = local_268;
      local_278 = 0;
      local_270 = 5;
      local_240.data_ = (pointer)local_240.firstElement;
      local_240.len = 0;
      local_240.cap = 2;
      local_148.data_ = (pointer)local_148.firstElement;
      local_148.len = 0;
      local_148.cap = 2;
      local_40 = false;
      local_50.startLoc = (SourceLocation)0x0;
      local_50.endLoc = (SourceLocation)0x0;
      EvalContext::pushEmptyFrame((EvalContext *)local_388);
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_580,
                        (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_5a8);
      __v = &EvalContext::createLocal
                       ((EvalContext *)local_388,&symbol->super_ValueSymbol,
                        (ConstantValue *)&local_580)->value;
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_580);
      pvVar17 = std::
                get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          (__v);
      if ((pvVar17->super_SVIntStorage).unknownFlag == true) {
        SVar46 = parsing::Token::range(&local_768);
        pDVar18 = ASTContext::addDiag((ASTContext *)local_640,(DiagCode)0x3e0006,SVar46);
        Diagnostic::operator<<(pDVar18,(ConstantValue *)__v);
      }
      local_4d8 = (Storage *)local_558;
      local_4d0._8_8_ = 0x3f;
      local_4d0._16_8_ = 1;
      stack0xfffffffffffffb48 = ZEXT816(0x92b3d0);
      local_4a8.ml = 0;
      local_4a8.size = 0;
      local_448[0].data_ = (pointer)local_448[0].firstElement;
      local_448[0].len = 0;
      local_448[0].cap = 8;
      uVar23 = uVar27;
      local_4d0._0_8_ = local_4d8;
      if (uVar27 <= local_708) {
        do {
          local_6d0 = uVar23;
          Expression::eval((ConstantValue *)&local_730,pEVar15,(EvalContext *)local_388);
          if (local_710 == '\0') {
            bVar9 = false;
LAB_00756698:
            this_00->valid = bVar9;
LAB_00756419:
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&local_730);
            if (local_448[0].len == 0) {
              Expression::eval((ConstantValue *)&local_3b0,local_750,(EvalContext *)local_388);
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage(&local_3b0);
            }
            EvalContext::reportAllDiags((EvalContext *)local_388);
            src = extraout_RDX;
            if ((this_00->valid == true) &&
               (bVar9 = Scope::isUninstantiated(*(Scope **)SVar20), src = extraout_RDX_00,
               local_448[0].len != 0)) {
              lVar26 = local_448[0].len << 4;
              other = &(local_448[0].data_)->super_SVIntStorage;
              do {
                SVInt::SVInt((SVInt *)&local_498,other);
                local_498._M_index = '\x01';
                fromSyntax::anon_class_48_6_985204b5::operator()
                          (&local_6b0,(ConstantValue *)&local_498,bVar9);
                std::__detail::__variant::
                _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ::~_Variant_storage(&local_498);
                other = other + 1;
                lVar26 = lVar26 + -0x10;
                src = extraout_RDX_01;
              } while (lVar26 != 0);
            }
            iVar11 = SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::copy
                               (&local_608.
                                 super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>,
                                (EVP_PKEY_CTX *)local_740,src);
            ppGVar6 = local_608.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.data_
            ;
            (this_00->entries)._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar11);
            (this_00->entries)._M_extent._M_extent_value = extraout_RDX_02;
            if (local_608.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.len == 0) {
              local_730._8_4_ = 0x20;
              local_730._12_2_ = 1;
              local_730._0_8_ = (void *)0x0;
              SVInt::clearUnusedBits((SVInt *)&local_730);
              local_668._0_8_ = local_730._0_8_;
              local_668._8_4_ = local_730._8_4_;
              local_668._12_1_ = local_730._12_1_;
              local_668._13_1_ = local_730._13_1_;
              if (0x40 < (uint)local_730._8_4_ || (local_730._12_2_ & 0x100) != 0) {
                local_730._0_8_ = (void *)0x0;
              }
              member = &local_668;
              local_648 = 1;
              fromSyntax::anon_class_48_6_985204b5::operator()
                        (&local_6b0,(ConstantValue *)member,true);
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)&local_668);
              if (((0x40 < (uint)local_730._8_4_) || ((local_730._12_2_ & 0x100) != 0)) &&
                 ((void *)local_730._0_8_ != (void *)0x0)) {
                operator_delete__((void *)local_730._0_8_);
              }
            }
            else {
              lVar26 = local_608.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.len
                       << 3;
              lVar24 = 0;
              do {
                member = *(_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           **)((long)ppGVar6 + lVar24);
                Scope::insertMember(&this_00->super_Scope,(Symbol *)member,
                                    (this_00->super_Scope).lastMember,false,true);
                lVar24 = lVar24 + 8;
              } while (lVar26 != lVar24);
            }
            goto LAB_007565ee;
          }
          bVar9 = ConstantValue::isTrue((ConstantValue *)&local_730);
          if (!bVar9) {
            bVar9 = local_710 != '\0';
            goto LAB_00756698;
          }
          pvVar17 = std::
                    get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                              (__v);
          SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt&>(local_448,pvVar17);
          pvVar17 = std::
                    get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                              (__v);
          sVar19 = SVInt::hash(pvVar17);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = sVar19;
          hash = SUB168(auVar2 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar2 * ZEXT816(0x9e3779b97f4a7c15),0);
          uVar23 = hash >> (local_4d0[8] & 0x3f);
          lVar26 = (hash & 0xff) * 4;
          uVar29 = (&UNK_0092f4ac)[lVar26];
          uVar30 = (&UNK_0092f4ad)[lVar26];
          uVar31 = (&UNK_0092f4ae)[lVar26];
          bVar32 = (&UNK_0092f4af)[lVar26];
          uVar22 = (ulong)((uint)hash & 7);
          uVar21 = 0;
          pos0 = uVar23;
          uVar33 = uVar29;
          uVar34 = uVar30;
          uVar35 = uVar31;
          bVar36 = bVar32;
          uVar37 = uVar29;
          uVar38 = uVar30;
          uVar39 = uVar31;
          bVar40 = bVar32;
          uVar41 = uVar29;
          uVar42 = uVar30;
          uVar43 = uVar31;
          bVar44 = bVar32;
          local_738 = pvVar17;
          do {
            uVar7 = local_4d0._24_8_;
            pgVar1 = (group_type_pointer)(local_4d0._24_8_ + uVar23 * 0x10);
            local_5b8 = pgVar1->m[0].n;
            uStack_5b7 = pgVar1->m[1].n;
            uStack_5b6 = pgVar1->m[2].n;
            bStack_5b5 = pgVar1->m[3].n;
            uStack_5b4 = pgVar1->m[4].n;
            uStack_5b3 = pgVar1->m[5].n;
            uStack_5b2 = pgVar1->m[6].n;
            bStack_5b1 = pgVar1->m[7].n;
            uStack_5b0 = pgVar1->m[8].n;
            uStack_5af = pgVar1->m[9].n;
            uStack_5ae = pgVar1->m[10].n;
            bStack_5ad = pgVar1->m[0xb].n;
            uStack_5ac = pgVar1->m[0xc].n;
            uStack_5ab = pgVar1->m[0xd].n;
            uStack_5aa = pgVar1->m[0xe].n;
            bVar10 = pgVar1->m[0xf].n;
            auVar28[0] = -(local_5b8 == uVar29);
            auVar28[1] = -(uStack_5b7 == uVar30);
            auVar28[2] = -(uStack_5b6 == uVar31);
            auVar28[3] = -(bStack_5b5 == bVar32);
            auVar28[4] = -(uStack_5b4 == uVar33);
            auVar28[5] = -(uStack_5b3 == uVar34);
            auVar28[6] = -(uStack_5b2 == uVar35);
            auVar28[7] = -(bStack_5b1 == bVar36);
            auVar28[8] = -(uStack_5b0 == uVar37);
            auVar28[9] = -(uStack_5af == uVar38);
            auVar28[10] = -(uStack_5ae == uVar39);
            auVar28[0xb] = -(bStack_5ad == bVar40);
            auVar28[0xc] = -(uStack_5ac == uVar41);
            auVar28[0xd] = -(uStack_5ab == uVar42);
            auVar28[0xe] = -(uStack_5aa == uVar43);
            auVar28[0xf] = -(bVar10 == bVar44);
            uVar12 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
            bStack_5a9 = bVar10;
            if (uVar12 != 0) {
              local_6d8 = pSStack_4b0 + uVar23 * 0xf;
              local_6f8 = uVar22;
              local_6f0 = uVar21;
              local_6e8 = uVar23;
              local_6e0 = pos0;
              local_5c8 = uVar29;
              uStack_5c7 = uVar30;
              uStack_5c6 = uVar31;
              bStack_5c5 = bVar32;
              uStack_5c4 = uVar33;
              uStack_5c3 = uVar34;
              uStack_5c2 = uVar35;
              bStack_5c1 = bVar36;
              uStack_5c0 = uVar37;
              uStack_5bf = uVar38;
              uStack_5be = uVar39;
              bStack_5bd = bVar40;
              uStack_5bc = uVar41;
              uStack_5bb = uVar42;
              uStack_5ba = uVar43;
              bStack_5b9 = bVar44;
              do {
                iVar11 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
                  }
                }
                bVar9 = exactlyEqual(local_738,
                                     (SVInt *)((long)&(local_6d8->super_SVIntStorage).field_0 +
                                              (ulong)(uint)(iVar11 << 4)));
                if (bVar9) {
                  SVar46 = parsing::Token::range(&local_768);
                  code.subsystem = Declarations;
                  code.code = 0x3d;
                  SVar20 = local_748;
                  goto LAB_007563fe;
                }
                uVar12 = uVar12 - 1 & uVar12;
              } while (uVar12 != 0);
              bVar10 = ((group_type_pointer)(uVar7 + uVar23 * 0x10))->m[0xf].n;
              uVar23 = local_6e8;
              uVar21 = local_6f0;
              uVar22 = local_6f8;
              pos0 = local_6e0;
              uVar29 = local_5c8;
              uVar30 = uStack_5c7;
              uVar31 = uStack_5c6;
              bVar32 = bStack_5c5;
              uVar33 = uStack_5c4;
              uVar34 = uStack_5c3;
              uVar35 = uStack_5c2;
              bVar36 = bStack_5c1;
              uVar37 = uStack_5c0;
              uVar38 = uStack_5bf;
              uVar39 = uStack_5be;
              bVar40 = bStack_5bd;
              uVar41 = uStack_5bc;
              uVar42 = uStack_5bb;
              uVar43 = uStack_5ba;
              bVar44 = bStack_5b9;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[uVar22] & bVar10) == 0) break;
            lVar26 = uVar23 + uVar21;
            uVar21 = uVar21 + 1;
            uVar23 = lVar26 + 1U & local_4d0._16_8_;
          } while (uVar21 <= (ulong)local_4d0._16_8_);
          if (local_4a8.size < local_4a8.ml) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
            ::nosize_unchecked_emplace_at<slang::SVInt&>
                      ((locator *)&local_470,
                       (table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
                        *)local_4d0,(arrays_type *)(local_4d0 + 8),pos0,hash,local_738);
            local_4a8.size = local_4a8.size + 1;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
            ::unchecked_emplace_with_rehash<slang::SVInt&>
                      ((locator *)&local_470,
                       (table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
                        *)local_4d0,hash,local_738);
          }
          Expression::eval((ConstantValue *)&local_470,local_750,(EvalContext *)local_388);
          _Var8 = local_470._M_index;
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage(&local_470);
          SVar20 = local_748;
          if (_Var8 == '\0') goto LAB_00756419;
          pvVar17 = std::
                    get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                              (__v);
          uVar21 = local_6d0;
          if ((pvVar17->super_SVIntStorage).unknownFlag == true) {
            SVar46 = parsing::Token::range(&local_768);
            code.subsystem = Declarations;
            code.code = 0x3e;
LAB_007563fe:
            pDVar18 = ASTContext::addDiag((ASTContext *)local_640,code,SVar46);
            Diagnostic::operator<<(pDVar18,(ConstantValue *)__v);
            goto LAB_00756419;
          }
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_730);
          uVar23 = uVar21 + uVar27;
        } while (uVar21 + uVar27 <= local_708);
      }
      SVar46 = parsing::Token::range(&syntax->keyword);
      member = (_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                *)0x6c0006;
      ASTContext::addDiag((ASTContext *)SVar20,(DiagCode)0x6c0006,SVar46);
LAB_007565ee:
      SmallVectorBase<slang::SVInt>::cleanup(local_448,(EVP_PKEY_CTX *)member);
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                     *)local_4d0);
      SmallVectorBase<slang::Diagnostic>::cleanup(&local_148,(EVP_PKEY_CTX *)member);
      SmallVectorBase<slang::Diagnostic>::cleanup(&local_240,(EVP_PKEY_CTX *)member);
      if (local_280 != local_268) {
        operator_delete(local_280);
      }
      SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup(&local_338,(EVP_PKEY_CTX *)member);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_5a8);
  if (local_608.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.data_ !=
      (pointer)local_608.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.firstElement
     ) {
    operator_delete(local_608.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.data_);
  }
  return this_00;
}

Assistant:

GenerateBlockArraySymbol& GenerateBlockArraySymbol::fromSyntax(Compilation& comp,
                                                               const LoopGenerateSyntax& syntax,
                                                               SymbolIndex scopeIndex,
                                                               const ASTContext& context,
                                                               uint32_t constructIndex) {
    auto [name, loc] = getGenerateBlockName(*syntax.block);
    auto result = comp.emplace<GenerateBlockArraySymbol>(comp, name, loc, constructIndex);
    result->setSyntax(syntax);
    result->setAttributes(*context.scope, syntax.attributes);

    auto genvar = syntax.identifier;
    if (genvar.isMissing())
        return *result;

    auto genvarSyntax = comp.emplace<IdentifierNameSyntax>(genvar);

    // Walk up the tree a bit to see if we're nested inside another generate loop.
    // If we are, we'll include that parent's array size in our decision about
    // wether we've looped too many times within one generate block.
    const uint64_t baseCount = getGenerateLoopCount(*context.scope);
    const uint64_t loopLimit = comp.getOptions().maxGenerateSteps;

    // If the loop initializer has a `genvar` keyword, we can use the name directly
    // Otherwise we need to do a lookup to make sure we have the actual genvar somewhere.
    if (!syntax.genvar) {
        auto symbol = Lookup::unqualifiedAt(*context.scope, genvar.valueText(),
                                            context.getLocation(), genvar.range());
        if (!symbol)
            return *result;

        if (symbol->kind != SymbolKind::Genvar) {
            auto& diag = context.addDiag(diag::NotAGenvar, genvar.range());
            diag << genvar.valueText();
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return *result;
        }

        comp.noteReference(*symbol);
    }
    else {
        // Fabricate a genvar symbol to live in this array since it was declared inline.
        auto genvarSymbol = comp.emplace<GenvarSymbol>(genvar.valueText(), genvar.location());
        genvarSymbol->setSyntax(*genvarSyntax);
        result->addMember(*genvarSymbol);
    }

    SmallVector<const GenerateBlockSymbol*> entries;
    auto createBlock = [&, blockLoc = loc](ConstantValue value, bool isUninstantiated) {
        // Spec: each generate block gets their own scope, with an implicit
        // localparam of the same name as the genvar.
        auto block = comp.emplace<GenerateBlockSymbol>(comp, "", blockLoc, (uint32_t)entries.size(),
                                                       isUninstantiated);
        auto implicitParam = comp.emplace<ParameterSymbol>(genvar.valueText(), genvar.location(),
                                                           true /* isLocal */, false /* isPort */);
        implicitParam->setSyntax(*genvarSyntax);
        comp.noteReference(*implicitParam);

        block->addMember(*implicitParam);
        block->setSyntax(*syntax.block);

        addBlockMembers(*block, *syntax.block);

        implicitParam->setType(comp.getIntegerType());
        implicitParam->setValue(comp, std::move(value), /* needsCoercion */ false);
        implicitParam->setIsFromGenvar(true);

        block->arrayIndex = &implicitParam->getValue().integer();
        entries.push_back(block);
    };

    // Bind the initialization expression.
    auto& initial = Expression::bindRValue(comp.getIntegerType(), *syntax.initialExpr,
                                           syntax.equals.range(), context);
    ConstantValue initialVal = context.eval(initial);
    if (!initialVal)
        return *result;

    // Fabricate a local variable that will serve as the loop iteration variable.
    auto& iterScope = *comp.emplace<StatementBlockSymbol>(comp, "", loc,
                                                          StatementBlockKind::Sequential,
                                                          VariableLifetime::Automatic);
    auto& local = *comp.emplace<VariableSymbol>(genvar.valueText(), genvar.location(),
                                                VariableLifetime::Automatic);
    local.setType(comp.getIntegerType());
    local.flags |= VariableFlags::CompilerGenerated;

    iterScope.setTemporaryParent(*context.scope, scopeIndex);
    iterScope.addMember(local);

    // Bind the stop and iteration expressions so we can reuse them on each iteration.
    ASTContext iterContext(iterScope, LookupLocation::max);
    auto& stopExpr = Expression::bind(*syntax.stopExpr, iterContext);
    auto& iterExpr = Expression::bind(*syntax.iterationExpr, iterContext,
                                      ASTFlags::AssignmentAllowed);
    if (stopExpr.bad() || iterExpr.bad())
        return *result;

    if (!context.requireBooleanConvertible(stopExpr))
        return *result;

    // Create storage for the iteration variable.
    EvalContext evalContext(iterContext);
    evalContext.pushEmptyFrame();

    auto loopVal = evalContext.createLocal(&local, initialVal);
    if (loopVal->integer().hasUnknown())
        iterContext.addDiag(diag::GenvarUnknownBits, genvar.range()) << *loopVal;

    // Generate blocks! In the first pass we evaluate all indices for correctness,
    // letting us enforce the loop limit to detect infinite loops before trying
    // to generate more hierarchy.
    uint64_t loopCount = 0;
    SmallSet<SVInt, 8> usedValues;
    SmallVector<SVInt, 8> indices;
    while (true) {
        loopCount += baseCount;
        if (loopCount > loopLimit) {
            context.addDiag(diag::MaxGenerateStepsExceeded, syntax.keyword.range());
            return *result;
        }

        auto stop = stopExpr.eval(evalContext);
        if (stop.bad() || !stop.isTrue()) {
            result->valid = !stop.bad();
            break;
        }

        indices.emplace_back(loopVal->integer());
        auto pair = usedValues.emplace(loopVal->integer());
        if (!pair.second) {
            iterContext.addDiag(diag::GenvarDuplicate, genvar.range()) << *loopVal;
            break;
        }

        if (!iterExpr.eval(evalContext))
            break;

        if (loopVal->integer().hasUnknown()) {
            iterContext.addDiag(diag::GenvarUnknownBits, genvar.range()) << *loopVal;
            break;
        }
    }

    // If we never ran the iteration expression, run it once to ensure
    // we've collected all errors.
    if (indices.empty())
        iterExpr.eval(evalContext);

    evalContext.reportAllDiags();

    // If the generate loop completed successfully, go through and create blocks.
    if (result->valid) {
        bool isUninstantiated = context.scope->isUninstantiated();
        for (auto& index : indices)
            createBlock(index, isUninstantiated);
    }

    result->entries = entries.copy(comp);
    if (entries.empty()) {
        createBlock(SVInt(32, 0, true), true);
    }
    else {
        for (auto entry : entries)
            result->addMember(*entry);
    }

    return *result;
}